

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O2

uint32_t __thiscall TcpSocket::Connect(TcpSocket *this)

{
  int iVar1;
  uint uVar2;
  runtime_error *this_00;
  socklen_t len;
  string local_238;
  sockaddr_storage source;
  stringstream stream;
  ostream local_188 [376];
  
  len = 0x80;
  iVar1 = getsockname((this->super_Socket).m_Socket,(sockaddr *)&source,&len);
  if (iVar1 == 0) {
    if (source.ss_family == 10) {
      uVar2 = 0xffffffff;
    }
    else if (source.ss_family == 2) {
      uVar2 = (uint)source.__ss_padding._2_4_ >> 0x18 | (source.__ss_padding._2_4_ & 0xff0000) >> 8
              | (source.__ss_padding._2_4_ & 0xff00) << 8 | source.__ss_padding._2_4_ << 0x18;
    }
    else {
      uVar2 = 0;
    }
    return uVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::operator<<(local_188,"Read local tcp/ip address failed");
  std::__cxx11::stringbuf::str();
  Logger::Log(3,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Read local tcp/ip address failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t TcpSocket::Connect() const
{
    struct sockaddr_storage source;
    socklen_t len = sizeof(source);

    if (getsockname(m_Socket, reinterpret_cast<sockaddr*>(&source), &len)) {
        LOG_ERROR("Read local tcp/ip address failed");
        throw std::runtime_error("Read local tcp/ip address failed");
    }

    switch (source.ss_family) {
    case AF_INET:
        return ntohl(reinterpret_cast<sockaddr_in*>(&source)->sin_addr.s_addr);

    case AF_INET6:
        return 0xffffffff;

    default:
        return 0;
    }
}